

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

bool __thiscall
DListBase<Memory::ArenaAllocator,_RealCount>::HasNode
          (DListBase<Memory::ArenaAllocator,_RealCount> *this,NodeBase *node)

{
  bool bVar1;
  DListNodeBase<Memory::ArenaAllocator> **ppDVar2;
  DListNodeBase<Memory::ArenaAllocator> *local_28;
  NodeBase *current;
  NodeBase *node_local;
  DListBase<Memory::ArenaAllocator,_RealCount> *this_local;
  
  local_28 = DListNodeBase<Memory::ArenaAllocator>::Next
                       (&this->super_DListNodeBase<Memory::ArenaAllocator>);
  while( true ) {
    bVar1 = IsHead(this,local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    if (node == local_28) break;
    ppDVar2 = DListNodeBase<Memory::ArenaAllocator>::Next(local_28);
    local_28 = *ppDVar2;
  }
  return true;
}

Assistant:

bool HasNode(NodeBase * node) const
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            if (node == current)
            {
                return true;
            }
            current = current->Next();
        }
        return false;
    }